

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O2

void __thiscall OpenMD::KirkwoodBuff::writeRdf(KirkwoodBuff *this)

{
  char cVar1;
  ostream *poVar2;
  uint j;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label;
  long lVar4;
  pointer pbVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Revision r;
  allocator_type local_372;
  allocator<char> local_371;
  allocator<char> local_370;
  allocator<char> local_36f;
  allocator<char> local_36e;
  allocator<char> local_36d;
  allocator<char> local_36c;
  allocator<char> local_36b;
  allocator<char> local_36a;
  allocator<char> local_369;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string local_350;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  ofstream ofs;
  
  std::ofstream::ofstream
            (&ofs,(this->super_MultiComponentRDF).super_StaticAnalyser.outputFilename_._M_dataplus.
                  _M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"KirkwoodBuff: unable to open %s\n",
             (this->super_MultiComponentRDF).super_StaticAnalyser.outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(this->super_MultiComponentRDF).super_StaticAnalyser.
                                     analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_350,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_350);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_350);
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_350,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_350);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_350);
    poVar2 = std::operator<<((ostream *)&ofs,"# selection script1: \"");
    std::operator<<(poVar2,(string *)&(this->super_MultiComponentRDF).selectionScript1_);
    poVar2 = std::operator<<((ostream *)&ofs,"\"\tselection script2: \"");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_MultiComponentRDF).selectionScript2_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_MultiComponentRDF).super_StaticAnalyser.paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &(this->super_MultiComponentRDF).super_StaticAnalyser.
                                       paramString_);
      std::operator<<(poVar2,"\n");
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"g11",&local_369);
    std::__cxx11::string::string<std::allocator<char>>(local_330,"g12",&local_36a);
    std::__cxx11::string::string<std::allocator<char>>(local_310,"g22",&local_36b);
    std::__cxx11::string::string<std::allocator<char>>(local_2f0,"gC11",&local_36c);
    std::__cxx11::string::string<std::allocator<char>>(local_2d0,"gC12",&local_36d);
    std::__cxx11::string::string<std::allocator<char>>(local_2b0,"gC22",&local_36e);
    std::__cxx11::string::string<std::allocator<char>>(local_290,"G11",&local_36f);
    std::__cxx11::string::string<std::allocator<char>>(local_270,"G12",&local_370);
    std::__cxx11::string::string<std::allocator<char>>(local_250,"G22",&local_371);
    __l._M_len = 9;
    __l._M_array = &local_350;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&labels,__l,&local_372);
    lVar4 = 0x100;
    do {
      std::__cxx11::string::~string((string *)((long)&local_350._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::operator<<((ostream *)&ofs,"# r");
    for (pbVar5 = labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      poVar2 = std::operator<<((ostream *)&ofs,"\t");
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xf;
      std::operator<<(poVar2,(string *)pbVar5);
    }
    std::operator<<((ostream *)&ofs,'\n');
    for (uVar3 = 0; uVar3 < (this->super_MultiComponentRDF).super_StaticAnalyser.nBins_;
        uVar3 = uVar3 + 1) {
      std::ostream::_M_insert<double>((double)(uVar3 & 0xffffffff) * this->deltaR_);
      for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0x18) {
        poVar2 = std::operator<<((ostream *)&ofs,"\t");
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xf;
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)((long)&(((this->gofrs_).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar4) + uVar3 * 8));
      }
      for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0x18) {
        poVar2 = std::operator<<((ostream *)&ofs,"\t");
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xf;
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)((long)&(((this->gCorr_).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar4) + uVar3 * 8));
      }
      for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 0x18) {
        poVar2 = std::operator<<((ostream *)&ofs,"\t");
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xf;
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)((long)&(((this->G_).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar4) + uVar3 * 8));
      }
      std::operator<<((ostream *)&ofs,"\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&labels);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void KirkwoodBuff::writeRdf() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      std::vector<std::string> labels {"g11",  "g12", "g22", "gC11", "gC12",
                                       "gC22", "G11", "G12", "G22"};

      ofs << "# r";

      for (const auto& label : labels)
        ofs << "\t" << std::setw(15) << label;

      ofs << '\n';

      for (unsigned int j = 0; j < nBins_; ++j) {
        RealType r = deltaR_ * j;
        ofs << r;
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gofrs_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gCorr_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << G_[i][j];
        }
        ofs << "\n";
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "KirkwoodBuff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }